

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_lump.cpp
# Opt level: O0

bool __thiscall FLumpFile::Open(FLumpFile *this,bool quiet)

{
  FUncompressedLump *pFVar1;
  undefined8 *puVar2;
  char *from;
  long lVar3;
  FUncompressedLump *local_48;
  FString local_20;
  FString name;
  bool quiet_local;
  FLumpFile *this_local;
  
  name.Chars._7_1_ = quiet;
  ExtractFileBase((char *)&local_20,
                  SUB81((this->super_FUncompressedFile).super_FResourceFile.Filename,0));
  puVar2 = (undefined8 *)operator_new__(0x58);
  *puVar2 = 1;
  local_48 = (FUncompressedLump *)(puVar2 + 1);
  do {
    FUncompressedLump::FUncompressedLump(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != (FUncompressedLump *)(puVar2 + 0xb));
  (this->super_FUncompressedFile).Lumps = (FUncompressedLump *)(puVar2 + 1);
  pFVar1 = (this->super_FUncompressedFile).Lumps;
  from = FString::operator_cast_to_char_(&local_20);
  uppercopy((pFVar1->super_FResourceLump).field_3.Name,from);
  (((this->super_FUncompressedFile).Lumps)->super_FResourceLump).field_3.Name[8] = '\0';
  (((this->super_FUncompressedFile).Lumps)->super_FResourceLump).Owner = (FResourceFile *)this;
  *(undefined4 *)&(((this->super_FUncompressedFile).Lumps)->super_FResourceLump).field_0x4c = 0;
  lVar3 = FileReader::GetLength((this->super_FUncompressedFile).super_FResourceFile.Reader);
  (((this->super_FUncompressedFile).Lumps)->super_FResourceLump).LumpSize = (int)lVar3;
  (((this->super_FUncompressedFile).Lumps)->super_FResourceLump).Namespace = 0;
  (((this->super_FUncompressedFile).Lumps)->super_FResourceLump).Flags = '\0';
  FString::operator=(&(((this->super_FUncompressedFile).Lumps)->super_FResourceLump).FullName,
                     (char *)0x0);
  (this->super_FUncompressedFile).super_FResourceFile.NumLumps = 1;
  if ((name.Chars._7_1_ & 1) == 0) {
    Printf("\n");
  }
  FString::~FString(&local_20);
  return true;
}

Assistant:

bool FLumpFile::Open(bool quiet)
{
	FString name(ExtractFileBase (Filename));

	Lumps = new FUncompressedLump[1];	// must use array allocator
	uppercopy(Lumps->Name, name);
	Lumps->Name[8] = 0;
	Lumps->Owner = this;
	Lumps->Position = 0;
	Lumps->LumpSize = Reader->GetLength();
	Lumps->Namespace = ns_global;
	Lumps->Flags = 0;
	Lumps->FullName = NULL;
	NumLumps = 1;
	if (!quiet)
	{
		Printf("\n");
	}
	return true;
}